

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::tuple<int,_int>_>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::~IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this)

{
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *in_RDI;
  
  ~IteratorImpl(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

~IteratorImpl() override {}